

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<int,int>::emplace_helper<int_const&>
          (iterator *__return_storage_ptr__,void *this,int *key,int *args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  int *piVar4;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::findOrInsert<int>
            ((InsertionResult *)local_58,*this,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    piVar4 = (int *)operator_new(0x10);
    *piVar4 = *args;
    piVar4[2] = 0;
    piVar4[3] = 0;
    *(int *)pEVar2[bVar1].storage.data = *key;
    *(int **)(pEVar2[bVar1].storage.data + 8) = piVar4;
  }
  else {
    piVar4 = (int *)operator_new(0x10);
    *piVar4 = *args;
    piVar4[2] = 0;
    piVar4[3] = 0;
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(int **)(pEVar2[bVar1].storage.data + 8) = piVar4;
    *(undefined8 *)(piVar4 + 2) = uVar3;
  }
  *(long *)((long)this + 8) = *(long *)((long)this + 8) + 1;
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<int,_int>_> *)local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<int,_int>_> *)local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }